

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O1

uint64_t farmhash64_na(char *s,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  uint64_t uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  
  if (0x20 < len) {
    if (len < 0x41) {
      lVar6 = len * 2 + -0x651e95c4d06fbfb1;
      lVar3 = *(long *)s * -0x651e95c4d06fbfb1;
      uVar1 = *(long *)(s + (len - 8)) * lVar6;
      uVar7 = lVar3 + *(long *)(s + 8);
      uVar7 = (uVar1 >> 0x1e | uVar1 << 0x22) + (uVar7 >> 0x2b | uVar7 * 0x200000) +
              *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
      uVar2 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
      uVar1 = (uVar2 >> 0x12 | uVar2 << 0x2e) + lVar3 + uVar1;
      uVar2 = (uVar7 ^ uVar1) * lVar6;
      uVar8 = (uVar2 >> 0x2f ^ uVar1 ^ uVar2) * lVar6;
      uVar2 = (uVar7 + *(long *)(s + (len - 0x20))) * lVar6;
      uVar7 = *(long *)(s + 0x10) * lVar6 + *(long *)(s + 0x18);
      uVar1 = lVar3 + *(long *)(s + 0x18);
      uVar1 = (uVar1 >> 0x12 | uVar1 << 0x2e) + *(long *)(s + 0x10) * lVar6 + uVar2;
      uVar7 = ((uVar2 >> 0x1e | uVar2 << 0x22) + (uVar7 >> 0x2b | uVar7 * 0x200000) +
               ((uVar8 >> 0x2f ^ uVar8) * lVar6 + *(long *)(s + (len - 0x18))) * lVar6 ^ uVar1) *
              lVar6;
      uVar7 = (uVar7 >> 0x2f ^ uVar1 ^ uVar7) * lVar6;
      uVar4 = (uVar7 >> 0x2f ^ uVar7) * lVar6;
    }
    else {
      lVar9 = *(long *)s + 0x1529cba0ca458ff;
      uVar7 = len - 1 & 0xffffffffffffffc0;
      uVar8 = (ulong)((uint)(len - 1) & 0x3f);
      lVar11 = 0x226bb95b4e64b6d4;
      uVar2 = 0x134a747f856d0526;
      uVar13 = 0;
      lVar3 = 0;
      uVar1 = 0;
      lVar15 = 0;
      lVar6 = 0;
      do {
        uVar10 = lVar9 + lVar15 + lVar11 + *(long *)(s + uVar13 + 8);
        uVar12 = lVar11 + lVar6 + *(long *)(s + uVar13 + 0x30);
        lVar11 = lVar15 + *(long *)(s + uVar13 + 0x28) +
                 (uVar12 >> 0x2a | uVar12 * 0x400000) * -0x4b6d499041670d8d;
        uVar14 = uVar2 + lVar3;
        lVar6 = lVar6 * -0x4b6d499041670d8d + *(long *)(s + uVar13);
        uVar12 = *(long *)(s + uVar13 + 8) + lVar6 + *(long *)(s + uVar13 + 0x10);
        lVar15 = uVar12 + *(long *)(s + uVar13 + 0x18);
        uVar2 = (uVar10 >> 0x25 | uVar10 * 0x8000000) * -0x4b6d499041670d8d ^ uVar1;
        lVar9 = (uVar14 >> 0x21 | uVar14 * 0x80000000) * -0x4b6d499041670d8d;
        uVar10 = lVar3 + lVar6 + *(long *)(s + uVar13 + 0x18) + uVar2;
        lVar6 = lVar6 + (uVar12 >> 0x2c | uVar12 * 0x100000) + (uVar10 >> 0x15 | uVar10 << 0x2b);
        lVar5 = uVar1 + lVar9 + *(long *)(s + uVar13 + 0x20);
        uVar12 = *(long *)(s + uVar13 + 0x10) + lVar5 + lVar11 + *(long *)(s + uVar13 + 0x38);
        uVar1 = *(long *)(s + uVar13 + 0x28) + *(long *)(s + uVar13 + 0x30) + lVar5;
        lVar3 = uVar1 + *(long *)(s + uVar13 + 0x38);
        uVar1 = lVar5 + (uVar1 >> 0x2c | uVar1 * 0x100000) + (uVar12 >> 0x15 | uVar12 << 0x2b);
        uVar13 = uVar13 + 0x40;
      } while (uVar7 != uVar13);
      lVar5 = (uVar2 & 0xff) * 2 + -0x4b6d499041670d8d;
      lVar15 = lVar15 + lVar3 + uVar8;
      lVar3 = lVar3 + uVar8 + lVar15;
      uVar13 = lVar9 + lVar11 + *(long *)(s + uVar8 + (uVar7 - 0x37)) + lVar15;
      uVar10 = lVar11 + lVar6 + *(long *)(s + uVar8 + (uVar7 - 0xf));
      uVar12 = uVar1 * 9 ^ (uVar13 >> 0x25 | uVar13 * 0x8000000) * lVar5;
      uVar10 = lVar15 * 9 + *(long *)(s + uVar8 + (uVar7 - 0x17)) +
               (uVar10 >> 0x2a | uVar10 * 0x400000) * lVar5;
      uVar2 = uVar2 + lVar3;
      lVar6 = lVar6 * lVar5 + *(long *)(s + uVar8 + (uVar7 - 0x3f));
      uVar13 = lVar3 + lVar6 + uVar12 + *(long *)(s + uVar8 + (uVar7 - 0x27));
      uVar14 = *(long *)(s + uVar8 + (uVar7 - 0x37)) + *(long *)(s + uVar8 + (uVar7 - 0x2f)) + lVar6
      ;
      uVar2 = uVar2 >> 0x21 | uVar2 * 0x80000000;
      lVar3 = uVar2 * lVar5 + uVar1 + *(long *)(s + uVar8 + (uVar7 - 0x1f));
      uVar16 = *(long *)(s + uVar8 + (uVar7 - 0x17)) + *(long *)(s + uVar8 + (uVar7 - 0xf)) + lVar3;
      uVar17 = uVar16 + *(long *)(s + uVar8 + (uVar7 - 7));
      uVar1 = *(long *)(s + uVar8 + (uVar7 - 0x2f)) + uVar10 + *(long *)(s + uVar8 + (uVar7 - 7)) +
              lVar3;
      uVar1 = (uVar16 >> 0x2c | uVar16 * 0x100000) + lVar3 + (uVar1 >> 0x15 | uVar1 << 0x2b);
      uVar7 = (uVar14 + *(long *)(s + uVar8 + (uVar7 - 0x27)) ^ uVar17) * lVar5;
      uVar7 = (uVar7 >> 0x2f ^ uVar17 ^ uVar7) * lVar5;
      uVar7 = ((uVar14 >> 0x2c | uVar14 * 0x100000) + lVar6 + (uVar13 >> 0x15 | uVar13 << 0x2b) ^
              uVar1) * lVar5;
      uVar7 = (uVar7 >> 0x2f ^ uVar1 ^ uVar7) * lVar5;
      uVar7 = ((uVar7 >> 0x2f ^ uVar7) + uVar2) * lVar5;
      uVar7 = ((uVar10 >> 0x2f ^ uVar10) * -0x3c5a37a36834ced9 + uVar12 +
               (uVar7 >> 0x2f ^ uVar7) * lVar5 ^ uVar7) * lVar5;
      uVar7 = (uVar7 >> 0x2f ^ uVar7 ^ uVar7) * lVar5;
      uVar4 = (uVar7 >> 0x2f ^ uVar7) * lVar5;
    }
    return uVar4;
  }
  if (len < 0x11) {
    if (len < 8) {
      if (len < 4) {
        if (len == 0) {
          return 0x9ae16a3b2f90404f;
        }
        uVar7 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
        return (uVar7 >> 0x2f ^ uVar7) * -0x651e95c4d06fbfb1;
      }
      lVar6 = len * 2 + -0x651e95c4d06fbfb1;
      uVar7 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar6;
      uVar7 = (uVar7 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar7) * lVar6;
      uVar7 = uVar7 >> 0x2f ^ uVar7;
    }
    else {
      lVar6 = len * 2 + -0x651e95c4d06fbfb1;
      uVar1 = *(long *)s + 0x9ae16a3b2f90404f;
      uVar7 = *(ulong *)(s + (len - 8));
      uVar2 = ((uVar1 >> 0x19 | uVar1 << 0x27) + uVar7) * lVar6;
      uVar7 = ((uVar7 >> 0x25 | uVar7 << 0x1b) * lVar6 + uVar1 ^ uVar2) * lVar6;
      uVar7 = (uVar7 >> 0x2f ^ uVar2 ^ uVar7) * lVar6;
      uVar7 = uVar7 >> 0x2f ^ uVar7;
    }
  }
  else {
    lVar6 = len * 2 + -0x651e95c4d06fbfb1;
    uVar2 = *(long *)(s + (len - 8)) * lVar6;
    uVar7 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar1 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar1 = (uVar1 >> 0x12 | uVar1 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar2;
    uVar7 = ((uVar2 >> 0x1e | uVar2 << 0x22) + (uVar7 >> 0x2b | uVar7 * 0x200000) +
             *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 ^ uVar1) * lVar6;
    uVar7 = (uVar7 >> 0x2f ^ uVar1 ^ uVar7) * lVar6;
    uVar7 = uVar7 >> 0x2f ^ uVar7;
  }
  return uVar7 * lVar6;
}

Assistant:

uint64_t farmhash64_na(const char *s, size_t len) {
  const uint64_t seed = 81;
  if (len <= 32) {
    if (len <= 16) {
      return farmhash_na_len_0_to_16(s, len);
    } else {
      return farmhash_na_len_17_to_32(s, len);
    }
  } else if (len <= 64) {
    return farmhash_na_len_33_to_64(s, len);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 56 bytes: v, w, x, y, and z.
  uint64_t x = seed;
  uint64_t y = seed * k1 + 113;
  uint64_t z = smix(y * k2 + 113) * k2;
  uint128_c_t v = make_uint128_c_t(0, 0);
  uint128_c_t w = make_uint128_c_t(0, 0);
  x = x * k2 + fetch64(s);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    x = ror64(x + y + v.a + fetch64(s + 8), 37) * k1;
    y = ror64(y + v.b + fetch64(s + 48), 42) * k1;
    x ^= w.b;
    y += v.a + fetch64(s + 40);
    z = ror64(z + w.a, 33) * k1;
    v = weak_farmhash_na_len_32_with_seeds(s, v.b * k1, x + w.a);
    w = weak_farmhash_na_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
    swap64(&z, &x);
    s += 64;
  } while (s != end);
  uint64_t mul = k1 + ((z & 0xff) << 1);
  // Make s point to the last 64 bytes of input.
  s = last64;
  w.a += ((len - 1) & 63);
  v.a += w.a;
  w.a += v.a;
  x = ror64(x + y + v.a + fetch64(s + 8), 37) * mul;
  y = ror64(y + v.b + fetch64(s + 48), 42) * mul;
  x ^= w.b * 9;
  y += v.a * 9 + fetch64(s + 40);
  z = ror64(z + w.a, 33) * mul;
  v = weak_farmhash_na_len_32_with_seeds(s, v.b * mul, x + w.a);
  w = weak_farmhash_na_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
  swap64(&z, &x);
  return farmhash_len_16_mul(farmhash_len_16_mul(v.a, w.a, mul) + smix(y) * k0 + z,
                   farmhash_len_16_mul(v.b, w.b, mul) + x,
                   mul);
}